

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::anon_unknown_0::PortBackrefVisitor::visit<slang::ast::CopyClassExpression>
          (PortBackrefVisitor *this,CopyClassExpression *expr)

{
  CopyClassExpression *in_RSI;
  PortSymbol *in_RDI;
  ValueSymbol *unaff_retaddr;
  
  if ((in_RSI->super_Expression).kind == NamedValue) {
    Expression::as<slang::ast::NamedValueExpression>(&in_RSI->super_Expression);
    ValueSymbol::addPortBackref(unaff_retaddr,in_RDI);
  }
  else {
    CopyClassExpression::visitExprs<slang::ast::(anonymous_namespace)::PortBackrefVisitor&>
              (in_RSI,(PortBackrefVisitor *)in_RDI);
  }
  return;
}

Assistant:

void visit(const T& expr) {
        if constexpr (std::is_base_of_v<Expression, T>) {
            switch (expr.kind) {
                case ExpressionKind::NamedValue:
                    expr.template as<NamedValueExpression>().symbol.addPortBackref(port);
                    break;
                default:
                    if constexpr (HasVisitExprs<T, PortBackrefVisitor>) {
                        expr.visitExprs(*this);
                    }
                    break;
            }
        }
    }